

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

ostream * operator<<(ostream *stream,Request *req)

{
  char *__s;
  ostream *poVar1;
  size_t sVar2;
  pointer pHVar3;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(req->method)._M_dataplus._M_p,(req->method)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(req->uri)._M_dataplus._M_p,(req->uri)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," HTTP/",6);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,req->versionMajor);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,req->versionMinor);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  pHVar3 = (req->headers).
           super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pHVar3 != (req->headers).
                super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,(pHVar3->name)._M_dataplus._M_p,(pHVar3->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(pHVar3->value)._M_dataplus._M_p,(pHVar3->value)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      pHVar3 = pHVar3 + 1;
    } while (pHVar3 != (req->headers).
                       super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  __s = (req->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"+ keep-alive: ",0xe);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(stream,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return stream;
}

Assistant:

std::ostream & operator<< (std::ostream &stream, const httpparser::Request &req)
{
    stream << req.method << " " << req.uri << " HTTP/" 
           << req.versionMajor << "." << req.versionMinor << "\n";
           
    for(std::vector<httpparser::Request::HeaderItem>::const_iterator it = req.headers.begin();
        it != req.headers.end(); ++it)
    {
        stream << it->name << ": " << it->value << "\n";
    }
    
    stream << req.content.data() << "\n";
    stream << "+ keep-alive: " << req.keepAlive << "\n";;
    
    return stream;
}